

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signingprovider.cpp
# Opt level: O3

bool __thiscall
FlatSigningProvider::GetTaprootSpendData
          (FlatSigningProvider *this,XOnlyPubKey *output_key,TaprootSpendData *spenddata)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  long in_FS_OFFSET;
  TaprootBuilder builder;
  TaprootSpendData local_100;
  TaprootBuilder local_90;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_90.m_valid = true;
  local_90.m_branch.
  super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_90.m_branch.
  super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_90.m_branch.
  super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_90.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  local_90.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  local_90.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  local_90.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  local_90.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  local_90.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  local_90.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  local_90.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  local_90.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  local_90.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  local_90.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  local_90.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  local_90.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  local_90.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  local_90.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  local_90.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  local_90.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  local_90.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  local_90.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  local_90.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  local_90.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  local_90.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  local_90.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  local_90.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_90.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  local_90.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  local_90.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  local_90.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  local_90.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  local_90.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  local_90.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  local_90.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  local_90.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  local_90.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  local_90.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  local_90.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  local_90.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  local_90.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  local_90.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  local_90.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  local_90.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  local_90.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  local_90.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  local_90.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  local_90.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  local_90.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  local_90.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  local_90.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  local_90.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  local_90.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  local_90.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  local_90.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  local_90.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  local_90.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  local_90.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  local_90.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_90.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  local_90.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  local_90.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  local_90.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  local_90.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  local_90.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  local_90.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  local_90.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  bVar2 = LookupHelper<std::map<XOnlyPubKey,TaprootBuilder,std::less<XOnlyPubKey>,std::allocator<std::pair<XOnlyPubKey_const,TaprootBuilder>>>,XOnlyPubKey,TaprootBuilder>
                    (&this->tr_trees,output_key,&local_90);
  if (bVar2) {
    TaprootBuilder::GetSpendData(&local_100,&local_90);
    *(undefined8 *)
     ((spenddata->internal_key).m_keydata.super_base_blob<256U>.m_data._M_elems + 0x10) =
         local_100.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems._16_8_;
    *(undefined8 *)
     ((spenddata->internal_key).m_keydata.super_base_blob<256U>.m_data._M_elems + 0x18) =
         local_100.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems._24_8_;
    *(undefined8 *)(spenddata->internal_key).m_keydata.super_base_blob<256U>.m_data._M_elems =
         local_100.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems._0_8_;
    *(undefined8 *)((spenddata->internal_key).m_keydata.super_base_blob<256U>.m_data._M_elems + 8) =
         local_100.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems._8_8_;
    *(undefined8 *)(spenddata->merkle_root).super_base_blob<256U>.m_data._M_elems =
         local_100.merkle_root.super_base_blob<256U>.m_data._M_elems._0_8_;
    *(undefined8 *)((spenddata->merkle_root).super_base_blob<256U>.m_data._M_elems + 8) =
         local_100.merkle_root.super_base_blob<256U>.m_data._M_elems._8_8_;
    *(undefined8 *)((spenddata->merkle_root).super_base_blob<256U>.m_data._M_elems + 0x10) =
         local_100.merkle_root.super_base_blob<256U>.m_data._M_elems._16_8_;
    *(undefined8 *)((spenddata->merkle_root).super_base_blob<256U>.m_data._M_elems + 0x18) =
         local_100.merkle_root.super_base_blob<256U>.m_data._M_elems._24_8_;
    std::
    _Rb_tree<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_std::_Select1st<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
    ::clear(&(spenddata->scripts)._M_t);
    if (local_100.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0)
    {
      p_Var1 = &local_100.scripts._M_t._M_impl.super__Rb_tree_header;
      (spenddata->scripts)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
           local_100.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
      (spenddata->scripts)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           local_100.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      (spenddata->scripts)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           local_100.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (spenddata->scripts)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           local_100.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
      (local_100.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
           &(spenddata->scripts)._M_t._M_impl.super__Rb_tree_header._M_header;
      (spenddata->scripts)._M_t._M_impl.super__Rb_tree_header._M_node_count =
           local_100.scripts._M_t._M_impl.super__Rb_tree_header._M_node_count;
      local_100.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_100.scripts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_100.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      local_100.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    }
    std::
    _Rb_tree<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_std::_Select1st<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
    ::~_Rb_tree(&local_100.scripts._M_t);
  }
  std::
  vector<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
  ::~vector(&local_90.m_branch);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool FlatSigningProvider::GetTaprootSpendData(const XOnlyPubKey& output_key, TaprootSpendData& spenddata) const
{
    TaprootBuilder builder;
    if (LookupHelper(tr_trees, output_key, builder)) {
        spenddata = builder.GetSpendData();
        return true;
    }
    return false;
}